

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# araplanner.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
ARAPlanner::GetSearchPath
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,ARAPlanner *this,
          ARASearchStateSpace_t *pSearchStateSpace,int *solcost)

{
  void *pvVar1;
  DiscreteSpaceInformation *pDVar2;
  reference pvVar3;
  SBPL_Exception *this_00;
  value_type vVar4;
  int i;
  CMDPSTATE *__x;
  size_type __n;
  CMDPSTATE *local_78;
  vector<int,_std::allocator<int>_> SuccIDV;
  vector<int,_std::allocator<int>_> CostV;
  
  SuccIDV.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  CostV.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  SuccIDV.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  SuccIDV.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CostV.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  CostV.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (this->bforwardsearch == true) {
    local_78 = pSearchStateSpace->searchgoalstate;
    __x = pSearchStateSpace->searchstartstate;
    (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x2e])(this,pSearchStateSpace);
  }
  else {
    __x = pSearchStateSpace->searchgoalstate;
    local_78 = pSearchStateSpace->searchstartstate;
  }
  std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&__x->StateID);
  *solcost = 0;
  if (_stdout != 0) {
    while ((((__x->StateID != local_78->StateID &&
             (pvVar1 = __x->PlannerSpecificData, pvVar1 != (void *)0x0)) &&
            (*(long *)((long)pvVar1 + 0x38) != 0)) && (*(int *)((long)pvVar1 + 0x24) != 1000000000))
          ) {
      pDVar2 = (this->super_SBPLPlanner).environment_;
      (*pDVar2->_vptr_DiscreteSpaceInformation[5])(pDVar2,(ulong)(uint)__x->StateID,&SuccIDV,&CostV)
      ;
      vVar4 = 1000000000;
      for (__n = 0; (long)__n <
                    (long)(int)((ulong)((long)SuccIDV.super__Vector_base<int,_std::allocator<int>_>.
                                              _M_impl.super__Vector_impl_data._M_finish -
                                       (long)SuccIDV.super__Vector_base<int,_std::allocator<int>_>.
                                             _M_impl.super__Vector_impl_data._M_start) >> 2);
          __n = __n + 1) {
        pvVar3 = std::vector<int,_std::allocator<int>_>::at(&SuccIDV,__n);
        if (*pvVar3 == **(int **)((long)pvVar1 + 0x38)) {
          pvVar3 = std::vector<int,_std::allocator<int>_>::at(&CostV,__n);
          if (*pvVar3 < vVar4) {
            pvVar3 = std::vector<int,_std::allocator<int>_>::at(&CostV,__n);
            vVar4 = *pvVar3;
          }
        }
      }
      *solcost = *solcost + vVar4;
      __x = *(CMDPSTATE **)((long)pvVar1 + 0x38);
      std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&__x->StateID);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&CostV.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&SuccIDV.super__Vector_base<int,_std::allocator<int>_>);
    return __return_storage_ptr__;
  }
  this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
  SBPL_Exception::SBPL_Exception(this_00,"ERROR: could not open file");
  __cxa_throw(this_00,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

vector<int> ARAPlanner::GetSearchPath(ARASearchStateSpace_t* pSearchStateSpace, int& solcost)
{
    vector<int> SuccIDV;
    vector<int> CostV;
    vector<int> wholePathIds;
    ARAState* searchstateinfo;
    CMDPSTATE* state = NULL;
    CMDPSTATE* goalstate = NULL;
    CMDPSTATE* startstate = NULL;

    if (bforwardsearch) {
        startstate = pSearchStateSpace->searchstartstate;
        goalstate = pSearchStateSpace->searchgoalstate;

        //reconstruct the path by setting bestnextstate pointers appropriately
        ReconstructPath(pSearchStateSpace);
    }
    else {
        startstate = pSearchStateSpace->searchgoalstate;
        goalstate = pSearchStateSpace->searchstartstate;
    }

    state = startstate;

    wholePathIds.push_back(state->StateID);
    solcost = 0;

    FILE* fOut = stdout;
    if (fOut == NULL) {
        throw SBPL_Exception("ERROR: could not open file");
    }
    while (state->StateID != goalstate->StateID) {
        if (state->PlannerSpecificData == NULL) {
            SBPL_FPRINTF(fOut, "path does not exist since search data does not exist\n");
            break;
        }

        searchstateinfo = (ARAState*)state->PlannerSpecificData;

        if (searchstateinfo->bestnextstate == NULL) {
            SBPL_FPRINTF(fOut, "path does not exist since bestnextstate == NULL\n");
            break;
        }
        if (searchstateinfo->g == INFINITECOST) {
            SBPL_FPRINTF(fOut, "path does not exist since bestnextstate == NULL\n");
            break;
        }

        environment_->GetSuccs(state->StateID, &SuccIDV, &CostV);
        int actioncost = INFINITECOST;
        for (int i = 0; i < (int)SuccIDV.size(); i++) {
            if (SuccIDV.at(i) == searchstateinfo->bestnextstate->StateID && CostV.at(i) < actioncost) {
                actioncost = CostV.at(i);
            }
        }
        if (actioncost == INFINITECOST) SBPL_PRINTF("WARNING: actioncost = %d\n", actioncost);

        solcost += actioncost;

        //SBPL_FPRINTF(fDeb, "actioncost=%d between states %d and %d\n",
        //        actioncost, state->StateID, searchstateinfo->bestnextstate->StateID);
        //environment_->PrintState(state->StateID, false, fDeb);
        //environment_->PrintState(searchstateinfo->bestnextstate->StateID, false, fDeb);

#if DEBUG
        ARAState* nextstateinfo = (ARAState*)(searchstateinfo->bestnextstate->PlannerSpecificData);
        if (actioncost != abs((int)(searchstateinfo->g - nextstateinfo->g)) &&
            pSearchStateSpace->eps_satisfied <= 1.001)
        {
            SBPL_FPRINTF(fDeb, "ERROR: actioncost=%d is not matching the difference in g-values of %d\n",
                         actioncost, abs((int)(searchstateinfo->g - nextstateinfo->g)));
            SBPL_ERROR("ERROR: actioncost=%d is not matching the difference in g-values of %d\n",
                       actioncost,abs((int)(searchstateinfo->g - nextstateinfo->g)));
            PrintSearchState(searchstateinfo, fDeb);
            PrintSearchState(nextstateinfo, fDeb);
        }
#endif

        state = searchstateinfo->bestnextstate;

        wholePathIds.push_back(state->StateID);
    }

    return wholePathIds;
}